

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O0

void Bmc_MnaSelect(Gia_Man_t *p,Vec_Int_t *vCos,Vec_Int_t *vNodes,Vec_Int_t *vLeaves)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  bool bVar3;
  undefined4 local_34;
  Gia_Obj_t *pGStack_30;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vLeaves_local;
  Vec_Int_t *vNodes_local;
  Vec_Int_t *vCos_local;
  Gia_Man_t *p_local;
  
  Vec_IntClear(vLeaves);
  local_34 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vCos);
    bVar3 = false;
    if (local_34 < iVar1) {
      iVar1 = Vec_IntEntry(vCos,local_34);
      pGStack_30 = Gia_ManObj(p,iVar1);
      bVar3 = pGStack_30 != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    pGVar2 = Gia_ObjFanin0(pGStack_30);
    Bmc_MnaSelect_rec(p,pGVar2,vLeaves);
    local_34 = local_34 + 1;
  }
  pGVar2 = Gia_ManConst0(p);
  *(ulong *)pGVar2 = *(ulong *)pGVar2 & 0x7fffffffffffffff;
  local_34 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vNodes);
    bVar3 = false;
    if (local_34 < iVar1) {
      iVar1 = Vec_IntEntry(vNodes,local_34);
      pGStack_30 = Gia_ManObj(p,iVar1);
      bVar3 = pGStack_30 != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    *(ulong *)pGStack_30 = *(ulong *)pGStack_30 & 0x7fffffffffffffff;
    local_34 = local_34 + 1;
  }
  return;
}

Assistant:

void Bmc_MnaSelect( Gia_Man_t * p, Vec_Int_t * vCos, Vec_Int_t * vNodes, Vec_Int_t * vLeaves )
{
    Gia_Obj_t * pObj;
    int i;
    Vec_IntClear( vLeaves );
    Gia_ManForEachObjVec( vCos, p, pObj, i )
        Bmc_MnaSelect_rec( p, Gia_ObjFanin0(pObj), vLeaves );
    Gia_ManConst0(p)->fPhase = 0;
    Gia_ManForEachObjVec( vNodes, p, pObj, i )
        pObj->fPhase = 0;
}